

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O2

void __thiscall VcdGen::VcdGenerator::header(VcdGenerator *this)

{
  std::__cxx11::string::append((char *)&this->vcd_data_);
  return;
}

Assistant:

void header()
    {
        vcd_data_ += R"""($date
    Aug 27, 2021
$end
$version
   VCD generator tool version V0.1
$end
$timescale 1ps $end
)""";
    }